

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters *params)

{
  string local_148;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_128;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_108;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_e8;
  Resources res;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_48;
  
  Environment::Environment(&env,(Context *)this,4);
  DescriptorSetLayout::Resources::Resources(&res,&env,(Parameters *)context);
  DescriptorSetLayout::create((Move<vk::Handle<(vk::HandleType)19>_> *)&local_128,&env,&res,params);
  local_148.field_2._M_allocated_capacity = (size_type)local_128.m_data.deleter.m_device;
  local_148.field_2._8_8_ = local_128.m_data.deleter.m_allocator;
  local_148._M_dataplus._M_p = (pointer)local_128.m_data.object.m_internal;
  local_148._M_string_length = (size_type)local_128.m_data.deleter.m_deviceIface;
  local_128.m_data.object.m_internal = 0;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_128.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_128);
  DescriptorSetLayout::create((Move<vk::Handle<(vk::HandleType)19>_> *)&local_108,&env,&res,params);
  local_128.m_data.deleter.m_device = local_108.m_data.deleter.m_device;
  local_128.m_data.deleter.m_allocator = local_108.m_data.deleter.m_allocator;
  local_128.m_data.object.m_internal = local_108.m_data.object.m_internal;
  local_128.m_data.deleter.m_deviceIface = local_108.m_data.deleter.m_deviceIface;
  local_108.m_data.object.m_internal = 0;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_108.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_108);
  DescriptorSetLayout::create((Move<vk::Handle<(vk::HandleType)19>_> *)&local_e8,&env,&res,params);
  local_108.m_data.deleter.m_device = local_e8.m_data.deleter.m_device;
  local_108.m_data.deleter.m_allocator = local_e8.m_data.deleter.m_allocator;
  local_108.m_data.object.m_internal = local_e8.m_data.object.m_internal;
  local_108.m_data.deleter.m_deviceIface = local_e8.m_data.deleter.m_deviceIface;
  local_e8.m_data.object.m_internal = 0;
  local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_e8);
  DescriptorSetLayout::create((Move<vk::Handle<(vk::HandleType)19>_> *)&local_48,&env,&res,params);
  local_e8.m_data.deleter.m_device = local_48.m_data.deleter.m_device;
  local_e8.m_data.deleter.m_allocator = local_48.m_data.deleter.m_allocator;
  local_e8.m_data.object.m_internal = local_48.m_data.object.m_internal;
  local_e8.m_data.deleter.m_deviceIface = local_48.m_data.deleter.m_deviceIface;
  local_48.m_data.object.m_internal = 0;
  local_48.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_48.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_48);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Ok",(allocator<char> *)&local_128);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  DescriptorSetLayout::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}